

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O2

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Int64(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
        *this,int64_t i64)

{
  bool bVar1;
  
  Prefix(this,kNumberType);
  bVar1 = WriteInt64(this,i64);
  return bVar1;
}

Assistant:

bool Int64(int64_t i64)     { Prefix(kNumberType); return EndValue(WriteInt64(i64)); }